

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O2

void bfgs_rec(double *H,int N,int iter,int m,double *jac,double *sk,double *yk,double *r)

{
  long lVar1;
  double *B;
  double *C;
  double *A;
  double *B_00;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  double *pdVar7;
  long lVar8;
  double *pdVar9;
  ulong uVar10;
  double dVar11;
  
  uVar5 = (ulong)(uint)m;
  lVar1 = (long)N;
  sVar6 = lVar1 * 8;
  B = (double *)malloc(sVar6);
  C = (double *)malloc(8);
  A = (double *)malloc(sVar6);
  B_00 = (double *)malloc(sVar6);
  sVar6 = (long)m << 3;
  __ptr = malloc(sVar6);
  __ptr_00 = malloc(sVar6);
  __ptr_01 = malloc(sVar6);
  uVar2 = 0;
  uVar10 = 0;
  if (0 < N) {
    uVar10 = (ulong)(uint)N;
  }
  for (; uVar10 != uVar2; uVar2 = uVar2 + 1) {
    B[uVar2] = jac[uVar2];
    A[uVar2] = 0.0;
    B_00[uVar2] = 0.0;
  }
  uVar4 = 0;
  uVar2 = 0;
  if (0 < m) {
    uVar2 = uVar5;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    *(undefined8 *)((long)__ptr_00 + uVar4 * 8) = 0;
    *(undefined8 *)((long)__ptr + uVar4 * 8) = 0;
  }
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    *(undefined8 *)((long)__ptr_01 + uVar4 * 8) = 0;
  }
  if (iter < m) {
    uVar5 = (ulong)(uint)iter;
  }
  lVar8 = (long)(int)uVar5;
  lVar3 = (lVar8 + -1) * lVar1;
  pdVar7 = yk + lVar3;
  pdVar9 = sk + lVar3;
  while (0 < lVar8) {
    lVar8 = lVar8 + -1;
    for (uVar2 = 0; uVar10 != uVar2; uVar2 = uVar2 + 1) {
      A[uVar2] = pdVar7[uVar2];
      B_00[uVar2] = pdVar9[uVar2];
    }
    mmult(A,B_00,C,1,N,1);
    dVar11 = *C;
    *(double *)((long)__ptr_01 + lVar8 * 8) = 1.0 / dVar11;
    mmult(B_00,B,(double *)((long)__ptr + lVar8 * 8),1,N,1);
    dVar11 = (1.0 / dVar11) * *(double *)((long)__ptr + lVar8 * 8);
    *(double *)((long)__ptr + lVar8 * 8) = dVar11;
    for (uVar2 = 0; uVar10 != uVar2; uVar2 = uVar2 + 1) {
      B[uVar2] = pdVar7[uVar2] * -dVar11 + B[uVar2];
    }
    pdVar7 = pdVar7 + -lVar1;
    pdVar9 = pdVar9 + -lVar1;
  }
  mmult(H,B,r,N,N,1);
  uVar2 = 0;
  if ((int)uVar5 < 1) {
    uVar5 = uVar2;
  }
  for (; uVar2 != uVar5; uVar2 = uVar2 + 1) {
    for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
      A[uVar4] = yk[uVar4];
    }
    mmult(A,r,(double *)((long)__ptr_00 + uVar2 * 8),1,N,1);
    dVar11 = *(double *)((long)__ptr_01 + uVar2 * 8) * *(double *)((long)__ptr_00 + uVar2 * 8);
    *(double *)((long)__ptr_00 + uVar2 * 8) = dVar11;
    for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
      r[uVar4] = (*(double *)((long)__ptr + uVar2 * 8) - dVar11) * sk[uVar4] + r[uVar4];
    }
    yk = yk + lVar1;
    sk = sk + lVar1;
  }
  free(B);
  free(C);
  free(__ptr_01);
  free(__ptr);
  free(A);
  free(B_00);
  free(__ptr_00);
  return;
}

Assistant:

void bfgs_rec(double *H,int N,int iter,int m,double *jac,double *sk,double *yk,double *r) {
	int i,ptr,k,bound;
	double *q,*temp,*rho,*alpha,*temp1,*temp2,*qs,*beta;


	q = (double*) malloc(sizeof(double) *N);
	temp = (double*) malloc(sizeof(double) *1);
	temp1 = (double*) malloc(sizeof(double) *N);
	temp2 = (double*) malloc(sizeof(double) *N);
	alpha = (double*) malloc(sizeof(double) * m);
	beta = (double*) malloc(sizeof(double) * m);
	rho = (double*) malloc(sizeof(double) * m);
	qs = (double*) malloc(sizeof(double) * m);

	k = 0; ptr = 0; i = 0; bound = 0;
	
	for(i = 0;i < N;++i) {
		q[i] = jac[i];
		temp1[i] = 0.0;
		temp2[i] = 0.0;
	}

	if (iter <= m) {
		bound = iter;
	} else {
		bound = m;
	}

	for (i = 0; i < m;++i) {
		alpha[i] = beta[i] = 0.0;
	}

	for (i = 0; i < m;++i) {
		rho[i] = qs[i] = 0.0;
	}

	//mmult(yk,sk,temp,1,N,1);

	for (i = bound - 1; i >= 0; --i) {
		ptr = i * N;
		for(k = 0; k < N;++k) {
			temp1[k] = yk[ptr+k];
			temp2[k] = sk[ptr+k];
		}
		mmult(temp1,temp2,temp,1,N,1);
		rho[i] = 1.0/temp[0];
		mmult(temp2,q,alpha+i,1,N,1);
		alpha[i] *= rho[i];
		for(k = 0; k < N; ++k) {
			q[k] = q[k] - alpha[i] * yk[ptr + k];
		}
	}
	mmult(H,q,r,N,N,1);
	for (i = 0; i < bound;++i) {
		ptr = i * N;
		for(k = 0; k < N;++k) {
			temp1[k] = yk[ptr+k];
			//temp2[k] = r[ptr+k];
		}
		mmult(temp1,r,beta+i,1,N,1);
		beta[i] *= rho[i];
		for (k = 0; k < N;++k) {
			r[k] += sk[ptr+k] * (alpha[i] - beta[i]);
		}
	}

	

	free(q);
	free(temp);
	free(rho);
	free(alpha);
	free(temp1);
	free(temp2);
	free(qs);
	free(beta);
}